

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::i32_Trunc_f32u(w3Interp *this)

{
  float *pfVar1;
  
  pfVar1 = w3Stack::f32(&this->super_w3Stack);
  w3Stack::set_u32(&this->super_w3Stack,(uint32_t)(long)*pfVar1);
  return;
}

Assistant:

INTERP (i32_Trunc_f32u)
{
    set_u32 ((uint32_t)f32 ());
}